

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
::LookupBucketFor<llvm::MCRegister>
          (DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
           *this,MCRegister *Val,DenseMapPair<llvm::MCRegister,_int> **FoundBucket)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  DenseMapPair<llvm::MCRegister,_int> *pDVar4;
  uint uVar5;
  ulong uVar6;
  DenseMapPair<llvm::MCRegister,_int> *pDVar7;
  int iVar8;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar4 = (DenseMapPair<llvm::MCRegister,_int> *)0x0;
LAB_00d975c9:
    bVar2 = false;
  }
  else {
    uVar1 = Val->Reg;
    if (0xfffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::MCRegister, int>, llvm::MCRegister, int, llvm::DenseMapInfo<MCRegister>, llvm::detail::DenseMapPair<llvm::MCRegister, int>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::MCRegister, int>, KeyT = llvm::MCRegister, ValueT = int, KeyInfoT = llvm::DenseMapInfo<MCRegister>, BucketT = llvm::detail::DenseMapPair<llvm::MCRegister, int>, LookupKeyT = llvm::MCRegister]"
                   );
    }
    uVar3 = *(int *)(this + 0x10) - 1;
    uVar6 = (ulong)(uVar1 * 0x25 & uVar3);
    pDVar4 = (DenseMapPair<llvm::MCRegister,_int> *)(*(long *)this + uVar6 * 8);
    uVar5 = (pDVar4->super_pair<llvm::MCRegister,_int>).first.Reg;
    bVar2 = true;
    if (uVar1 != uVar5) {
      iVar8 = 1;
      pDVar7 = (DenseMapPair<llvm::MCRegister,_int> *)0x0;
      do {
        if (uVar5 == 0xffffffff) {
          if (pDVar7 != (DenseMapPair<llvm::MCRegister,_int> *)0x0) {
            pDVar4 = pDVar7;
          }
          goto LAB_00d975c9;
        }
        if (pDVar7 != (DenseMapPair<llvm::MCRegister,_int> *)0x0) {
          pDVar4 = pDVar7;
        }
        if (uVar5 == 0xfffffffe) {
          pDVar7 = pDVar4;
        }
        uVar5 = (int)uVar6 + iVar8;
        iVar8 = iVar8 + 1;
        uVar6 = (ulong)(uVar5 & uVar3);
        pDVar4 = (DenseMapPair<llvm::MCRegister,_int> *)(*(long *)this + uVar6 * 8);
        uVar5 = (pDVar4->super_pair<llvm::MCRegister,_int>).first.Reg;
      } while (uVar1 != uVar5);
    }
  }
  *FoundBucket = pDVar4;
  return bVar2;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }